

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::vector<double,std::allocator<double>>>::
internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<std::vector<double,std::allocator<double>>> *this,
          vector<double,_std::allocator<double>_> *data)

{
  _Vector_base<double,_std::allocator<double>_> local_38;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,data);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_38,
             (vector<double,_std::allocator<double>_> *)&local_20);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  this[0x2a] = (Parameter<std::vector<double,std::allocator<double>>>)0x0;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(this + 0x30),
             (vector<double,_std::allocator<double>_> *)&local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return true;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }